

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_constants.cpp
# Opt level: O3

spv_result_t spvtools::val::ConstantPass(ValidationState_t *_,Instruction *inst)

{
  ushort uVar1;
  uint16_t uVar2;
  bool bVar3;
  int32_t iVar4;
  Op opcode;
  uint uVar5;
  uint uVar6;
  long *plVar7;
  ulong uVar8;
  DiagnosticStream *pDVar9;
  Instruction *pIVar10;
  Instruction *pIVar11;
  Instruction *pIVar12;
  size_type *psVar13;
  long lVar14;
  spv_result_t sVar15;
  spv_result_t sVar16;
  size_t sVar17;
  char *pcVar18;
  string opcode_name;
  string local_290;
  string local_270;
  Instruction *local_250;
  Instruction *local_248;
  uint local_23c;
  string local_238;
  uint local_214;
  Instruction *local_210;
  undefined1 local_208 [5];
  char cStack_203;
  undefined8 local_200;
  undefined2 local_1f8;
  undefined1 uStack_1f6;
  undefined5 uStack_1f5;
  spv_result_t local_38;
  
  uVar1 = (inst->inst_).opcode;
  switch(uVar1) {
  case 0x29:
  case 0x2a:
  case 0x30:
  case 0x31:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 != (Instruction *)0x0) && ((pIVar10->inst_).opcode == 0x14))
    goto switchD_001c6dcd_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Op",2);
    local_270._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
    pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_270);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9," Result Type <id> ",0x12);
    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
    pcVar18 = " is not a boolean type.";
    goto LAB_001c6e74;
  default:
    goto switchD_001c6dcd_caseD_2b;
  case 0x2c:
  case 0x33:
    local_1f8 = 0x704f;
    local_200 = 2;
    uStack_1f6 = 0;
    _local_208 = (_Tuple_impl<1UL,_bool,_unsigned_int>)&local_1f8;
    spvOpcodeString((uint)uVar1);
    plVar7 = (long *)std::__cxx11::string::append(local_208);
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    psVar13 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar13) {
      local_290.field_2._M_allocated_capacity = *psVar13;
      local_290.field_2._8_8_ = plVar7[3];
    }
    else {
      local_290.field_2._M_allocated_capacity = *psVar13;
      local_290._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_290._M_string_length = plVar7[1];
    *plVar7 = (long)psVar13;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if (_local_208 != (_Tuple_impl<1UL,_bool,_unsigned_int>)&local_1f8) {
      operator_delete((void *)_local_208,CONCAT53(uStack_1f5,CONCAT12(uStack_1f6,local_1f8)) + 1);
    }
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 == (Instruction *)0x0) ||
       (iVar4 = spvOpcodeIsComposite((uint)(pIVar10->inst_).opcode), iVar4 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," Result Type <id> ",0x12);
      ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is not a composite type.",0x19);
      sVar15 = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) goto LAB_001c73ce;
      goto LAB_001c73e3;
    }
    lVar14 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 2;
    uVar8 = lVar14 - 3;
    uVar2 = (pIVar10->inst_).opcode;
    sVar15 = SPV_SUCCESS;
    sVar16 = SPV_SUCCESS;
    switch(uVar2) {
    case 0x17:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
      if (uVar8 != uVar5) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> count does not match Result Type <id> ",
                   0x38);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar18 = "s vector component count.";
        lVar14 = 0x19;
LAB_001c7c11:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar14);
        sVar15 = local_38;
        goto LAB_001c8073;
      }
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
      local_248 = ValidationState_t::FindDef(_,uVar5);
      if (local_248 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar18 = "Component type is not defined.";
        lVar14 = 0x1e;
LAB_001c7e48:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar14);
        sVar15 = local_38;
        goto LAB_001c73e3;
      }
      if (0x20 < (ulong)((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        sVar17 = 2;
        do {
          uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,sVar17);
          local_250 = (Instruction *)CONCAT44(local_250._4_4_,uVar5);
          pIVar11 = ValidationState_t::FindDef(_,uVar5);
          if ((pIVar11 == (Instruction *)0x0) ||
             (bVar3 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar3))
          goto LAB_001c7d69;
          pIVar11 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
          if ((pIVar11 == (Instruction *)0x0) ||
             ((local_248->inst_).result_id != (pIVar11->inst_).result_id)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent <id> ",0x12);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(uint32_t)local_250);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"s type does not match Result Type <id> ",0x27);
            ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
            pcVar18 = "s vector element type.";
            lVar14 = 0x16;
LAB_001c8041:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar14);
            goto LAB_001c8050;
          }
          sVar17 = sVar17 + 1;
          sVar16 = sVar15;
        } while (sVar17 < (ulong)((long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
        break;
      }
      goto LAB_001c73e8;
    case 0x18:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
      if (uVar8 != uVar5) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> count does not match Result Type <id> ",
                   0x38);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        pcVar18 = "s matrix column count.";
        lVar14 = 0x16;
        goto LAB_001c7c11;
      }
      pIVar11 = ValidationState_t::FindDef
                          (_,(pIVar10->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[2]);
      if (pIVar11 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar18 = "Column type is not defined.";
        lVar14 = 0x1b;
        goto LAB_001c7e48;
      }
      local_214 = Instruction::GetOperandAs<unsigned_int>(pIVar11,2);
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar11,1);
      local_250 = ValidationState_t::FindDef(_,uVar5);
      if (local_250 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Component type is not defined.",0x1e);
        sVar15 = local_38;
        goto LAB_001c73e3;
      }
      local_210 = pIVar11;
      if ((ulong)((long)(inst->operands_).
                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_001c73e8;
      pIVar12 = (Instruction *)0x2;
      do {
        local_23c = Instruction::GetOperandAs<unsigned_int>(inst,(size_t)pIVar12);
        pIVar11 = ValidationState_t::FindDef(_,local_23c);
        if ((pIVar11 == (Instruction *)0x0) ||
           (bVar3 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar3)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          uVar5 = local_23c;
          goto LAB_001c7db9;
        }
        local_248 = pIVar12;
        pIVar12 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
        if (pIVar12 == (Instruction *)0x0) goto LAB_001c7e60;
        if ((local_210->inst_).opcode != (pIVar12->inst_).opcode) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_23c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," type does not match Result Type <id> ",0x26);
          ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
          pcVar18 = "s matrix column type.";
LAB_001c8226:
          lVar14 = 0x15;
          goto LAB_001c7b1a;
        }
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar12,1);
        pIVar11 = ValidationState_t::FindDef(_,uVar5);
        if ((local_250->inst_).result_id != (pIVar11->inst_).result_id) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_23c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," component type does not match Result Type <id> ",0x30);
          ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
          pcVar18 = "s matrix column component type.";
          lVar14 = 0x1f;
          goto LAB_001c7b1a;
        }
        if (local_214 !=
            (pIVar12->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3]) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,local_23c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," vector component count does not match Result Type <id> "
                     ,0x38);
          ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
          pcVar18 = "s vector component count.";
          lVar14 = 0x19;
          goto LAB_001c7b1a;
        }
        pIVar12 = (Instruction *)
                  ((long)&(local_248->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start + 1);
        sVar16 = sVar15;
      } while (pIVar12 < (Instruction *)
                         ((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4));
      break;
    case 0x19:
    case 0x1a:
    case 0x1b:
    case 0x1d:
      break;
    case 0x1c:
      uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
      pIVar11 = ValidationState_t::FindDef(_,uVar5);
      if (pIVar11 == (Instruction *)0x0) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar18 = "Element type is not defined.";
        lVar14 = 0x1c;
      }
      else {
        uVar5 = Instruction::GetOperandAs<unsigned_int>(pIVar10,2);
        pIVar12 = ValidationState_t::FindDef(_,uVar5);
        if (pIVar12 != (Instruction *)0x0) {
          local_248 = pIVar11;
          ValidationState_t::EvalInt32IfConst
                    ((tuple<bool,_bool,_unsigned_int> *)local_208,_,(pIVar12->inst_).result_id);
          if (((cStack_203 == '\x01') && (local_208[4] != false)) &&
             (uVar8 != ((ulong)_local_208 & 0xffffffff))) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent count does not match Result Type <id> ",
                       0x33);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(pIVar10->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            pcVar18 = "s array length.";
            lVar14 = 0xf;
            goto LAB_001c7c11;
          }
          sVar16 = sVar15;
          if (0x20 < (ulong)((long)(inst->operands_).
                                   super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start)) {
            sVar17 = 2;
            do {
              uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,sVar17);
              local_250 = (Instruction *)CONCAT44(local_250._4_4_,uVar5);
              pIVar11 = ValidationState_t::FindDef(_,uVar5);
              if ((pIVar11 == (Instruction *)0x0) ||
                 (bVar3 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar3))
              goto LAB_001c7d69;
              pIVar12 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
              if (pIVar12 == (Instruction *)0x0) goto LAB_001c7e60;
              if ((local_248->inst_).result_id != (pIVar12->inst_).result_id) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_290._M_dataplus._M_p,
                           local_290._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," Constituent <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(uint32_t)local_250);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_270._M_dataplus._M_p,
                           local_270._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"s type does not match Result Type <id> ",0x27);
                ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,local_238._M_dataplus._M_p,
                           local_238._M_string_length);
                pcVar18 = "s array element type.";
                goto LAB_001c8226;
              }
              sVar17 = sVar17 + 1;
            } while (sVar17 < (ulong)((long)(inst->operands_).
                                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(inst->operands_).
                                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start >> 4));
          }
          break;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar10);
        pcVar18 = "Length is not defined.";
        lVar14 = 0x16;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar14);
      sVar16 = local_38;
LAB_001c7e99:
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      break;
    case 0x1e:
      if ((long)(pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(pIVar10->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2 != lVar14 + -1) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," Constituent <id> ",0x12);
        ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," count does not match Result Type <id> ",0x27);
        ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
        pcVar18 = "s struct member count.";
        lVar14 = 0x16;
LAB_001c7b1a:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar14);
LAB_001c8050:
        sVar15 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001c8073;
      }
      sVar16 = sVar15;
      if (0x20 < (ulong)((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_start)) {
        sVar17 = 2;
        uVar5 = 3;
        local_248 = pIVar10;
        do {
          uVar6 = Instruction::GetOperandAs<unsigned_int>(inst,sVar17);
          local_250 = (Instruction *)CONCAT44(local_250._4_4_,uVar6);
          pIVar11 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar11 == (Instruction *)0x0) ||
             (bVar3 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar3))
          goto LAB_001c7d69;
          pIVar10 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
          if (pIVar10 == (Instruction *)0x0) goto LAB_001c7e60;
          uVar6 = Instruction::GetOperandAs<unsigned_int>(local_248,(ulong)(uVar5 - 2));
          pIVar11 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar11 == (Instruction *)0x0) ||
             ((pIVar11->inst_).result_id != (pIVar10->inst_).result_id)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," Constituent <id> ",0x12);
            ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(uint32_t)local_250);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," type does not match the Result Type <id> ",0x2a);
            ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(local_248->inst_).result_id);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
            pcVar18 = "s member type.";
            lVar14 = 0xe;
            goto LAB_001c8041;
          }
          sVar17 = (size_t)uVar5;
          uVar5 = uVar5 + 1;
        } while (sVar17 < (ulong)((long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 4));
      }
      break;
    default:
      if ((uVar2 == 0x1168) || (sVar16 = sVar15, uVar2 == 0x14ee)) {
        if (uVar8 != 1) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,(inst->inst_).type_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          pcVar18 = " count must be one.";
          lVar14 = 0x13;
          goto LAB_001c7ddb;
        }
        uVar5 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar11 = ValidationState_t::FindDef(_,uVar5);
        if ((pIVar11 == (Instruction *)0x0) ||
           (bVar3 = spvOpcodeIsConstantOrUndef((uint)(pIVar11->inst_).opcode), !bVar3)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," is not a constant or undef.",0x1c);
          sVar16 = local_38;
        }
        else {
          pIVar12 = ValidationState_t::FindDef(_,(pIVar11->inst_).type_id);
          if (pIVar12 == (Instruction *)0x0) {
LAB_001c7e60:
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar11);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Result type is not defined.",0x1b);
            sVar16 = local_38;
            goto LAB_001c7e99;
          }
          local_248 = pIVar12;
          uVar6 = Instruction::GetOperandAs<unsigned_int>(pIVar10,1);
          pIVar11 = ValidationState_t::FindDef(_,uVar6);
          if ((pIVar11 != (Instruction *)0x0) &&
             (sVar15 = SPV_SUCCESS, (pIVar11->inst_).result_id == (local_248->inst_).result_id))
          goto LAB_001c73e8;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," Constituent <id> ",0x12);
          ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208," type does not match the Result Type <id> ",0x2a);
          ValidationState_t::getIdName_abi_cxx11_(&local_238,_,(pIVar10->inst_).result_id);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,local_238._M_dataplus._M_p,local_238._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"s component type.",0x11);
          sVar16 = local_38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_238._M_dataplus._M_p != &local_238.field_2) {
            operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_270._M_dataplus._M_p != &local_270.field_2) {
          operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001c7e99;
      }
    }
    sVar15 = sVar16;
    goto LAB_001c73e8;
  case 0x2d:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 != (Instruction *)0x0) && ((pIVar10->inst_).opcode == 0x1a))
    goto switchD_001c6dcd_caseD_2b;
    pDVar9 = (DiagnosticStream *)local_208;
    ValidationState_t::diag(pDVar9,_,SPV_ERROR_INVALID_ID,pIVar10);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,"OpConstantSampler Result Type <id> ",0x23);
    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
    pcVar18 = " is not a sampler type.";
LAB_001c6e74:
    lVar14 = 0x17;
LAB_001c6e79:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar9,pcVar18,lVar14);
    sVar15 = pDVar9->error_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    break;
  case 0x2e:
    pIVar10 = ValidationState_t::FindDef(_,(inst->inst_).type_id);
    if ((pIVar10 != (Instruction *)0x0) &&
       (bVar3 = anon_unknown_1::IsTypeNullable(&pIVar10->words_,_), bVar3))
    goto switchD_001c6dcd_caseD_2b;
    pDVar9 = (DiagnosticStream *)local_208;
    ValidationState_t::diag(pDVar9,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,"OpConstantNull Result Type <id> ",0x20);
    ValidationState_t::getIdName_abi_cxx11_(&local_290,_,(inst->inst_).type_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9,local_290._M_dataplus._M_p,local_290._M_string_length);
    pcVar18 = " cannot have a null value.";
    lVar14 = 0x1a;
    goto LAB_001c6e79;
  case 0x32:
    uVar5 = Instruction::GetOperandAs<unsigned_int_const>(inst,0);
    pIVar10 = ValidationState_t::FindDef(_,uVar5);
    if (0xfffffffd < (pIVar10->inst_).opcode - 0x17) goto switchD_001c6dcd_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar18 = "Specialization constant must be an integer or floating-point number.";
    lVar14 = 0x44;
LAB_001c71c2:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar14);
    sVar15 = local_38;
    break;
  case 0x34:
    opcode = Instruction::GetOperandAs<spv::Op>(inst,2);
    uVar8 = (ulong)(opcode - OpAccessChain);
    if (opcode - OpAccessChain < 0x3f) {
      if ((0x4b90f00000000027U >> (uVar8 & 0x3f) & 1) == 0) {
        if (uVar8 == 0x30) {
          if (((_->features_).uconvert_spec_constant_op != false) ||
             (bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel),
             bVar3)) goto switchD_001c6dcd_caseD_2b;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar18 = 
          "Prior to SPIR-V 1.4, specialization constant operation UConvert requires Kernel capability or extension SPV_AMD_gpu_shader_int16"
          ;
          lVar14 = 0x80;
          goto LAB_001c71c2;
        }
        if (uVar8 != 0x33) goto LAB_001c7408;
        bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
        if (bVar3) goto switchD_001c6dcd_caseD_2b;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Specialization constant operation ",0x22);
        local_290._M_dataplus._M_p = spvOpcodeString(OpQuantizeToF16);
        pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_290);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar9," requires Shader capability",0x1b);
        sVar15 = pDVar9->error_;
        break;
      }
    }
    else {
LAB_001c7408:
      if ((0xc < opcode - OpFAdd) || ((0x1895U >> (opcode - OpFAdd & 0x1f) & 1) == 0))
      goto switchD_001c6dcd_caseD_2b;
    }
    bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
    if (bVar3) goto switchD_001c6dcd_caseD_2b;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Specialization constant operation ",0x22);
    local_290._M_dataplus._M_p = spvOpcodeString(opcode);
    pDVar9 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_290);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)pDVar9," requires Kernel capability",0x1b);
    sVar15 = pDVar9->error_;
  }
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_001c6eb0:
  if (sVar15 != SPV_SUCCESS) {
    return sVar15;
  }
switchD_001c6dcd_caseD_2b:
  iVar4 = spvOpcodeIsConstant((uint)(inst->inst_).opcode);
  sVar15 = SPV_SUCCESS;
  if ((((iVar4 != 0) &&
       (bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader), bVar3
       )) && (bVar3 = ValidationState_t::IsPointerType(_,(inst->inst_).type_id),
             sVar15 = SPV_SUCCESS, !bVar3)) &&
     (bVar3 = ValidationState_t::ContainsLimitedUseIntOrFloatType(_,(inst->inst_).type_id), bVar3))
  {
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Cannot form constants of 8- or 16-bit types",0x2b);
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar15 = local_38;
  }
  return sVar15;
LAB_001c7d69:
  ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,local_290._M_dataplus._M_p,local_290._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," Constituent <id> ",0x12)
  ;
  uVar5 = (uint32_t)local_250;
LAB_001c7db9:
  ValidationState_t::getIdName_abi_cxx11_(&local_270,_,uVar5);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_208,local_270._M_dataplus._M_p,local_270._M_string_length);
  pcVar18 = " is not a constant or undef.";
  lVar14 = 0x1c;
LAB_001c7ddb:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar18,lVar14);
  sVar15 = local_38;
LAB_001c8073:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
LAB_001c73ce:
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
LAB_001c73e3:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_001c73e8:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  goto LAB_001c6eb0;
}

Assistant:

spv_result_t ConstantPass(ValidationState_t& _, const Instruction* inst) {
  switch (inst->opcode()) {
    case spv::Op::OpConstantTrue:
    case spv::Op::OpConstantFalse:
    case spv::Op::OpSpecConstantTrue:
    case spv::Op::OpSpecConstantFalse:
      if (auto error = ValidateConstantBool(_, inst)) return error;
      break;
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      if (auto error = ValidateConstantComposite(_, inst)) return error;
      break;
    case spv::Op::OpConstantSampler:
      if (auto error = ValidateConstantSampler(_, inst)) return error;
      break;
    case spv::Op::OpConstantNull:
      if (auto error = ValidateConstantNull(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstant:
      if (auto error = ValidateSpecConstant(_, inst)) return error;
      break;
    case spv::Op::OpSpecConstantOp:
      if (auto error = ValidateSpecConstantOp(_, inst)) return error;
      break;
    default:
      break;
  }

  // Generally disallow creating 8- or 16-bit constants unless the full
  // capabilities are present.
  if (spvOpcodeIsConstant(inst->opcode()) &&
      _.HasCapability(spv::Capability::Shader) &&
      !_.IsPointerType(inst->type_id()) &&
      _.ContainsLimitedUseIntOrFloatType(inst->type_id())) {
    return _.diag(SPV_ERROR_INVALID_ID, inst)
           << "Cannot form constants of 8- or 16-bit types";
  }

  return SPV_SUCCESS;
}